

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O1

void ex_pow(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  int iVar2;
  t_float *ptVar3;
  t_float *ptVar4;
  t_float *ptVar5;
  long lVar6;
  char *fmt;
  long lVar7;
  double dVar8;
  double __y;
  
  lVar6 = argv->ex_type;
  if (lVar6 - 0xeU < 2) {
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
LAB_0019a01e:
        post("expr~: Int. error %d",0x26a);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar5;
    }
    ptVar5 = (optr->ex_cont).v_vec;
    ptVar4 = (argv->ex_cont).v_vec;
    lVar6 = argv[1].ex_type;
    if (lVar6 - 0xeU < 2) {
      iVar2 = e->exp_vsize;
      if (iVar2 == 0) {
        return;
      }
      ptVar3 = argv[1].ex_cont.v_vec;
      lVar6 = 0;
      do {
        dVar8 = pow((double)ptVar4[lVar6],(double)ptVar3[lVar6]);
        ptVar5[lVar6] = (float)dVar8;
        lVar6 = lVar6 + 1;
      } while (iVar2 != (int)lVar6);
      return;
    }
    if (lVar6 == 2) {
      iVar2 = e->exp_vsize;
      if (iVar2 == 0) {
        return;
      }
      fVar1 = argv[1].ex_cont.v_flt;
      lVar6 = 0;
      do {
        dVar8 = pow((double)ptVar4[lVar6],(double)fVar1);
        ptVar5[lVar6] = (float)dVar8;
        lVar6 = lVar6 + 1;
      } while (iVar2 != (int)lVar6);
      return;
    }
    if (lVar6 == 1) {
      iVar2 = e->exp_vsize;
      if (iVar2 == 0) {
        return;
      }
      lVar6 = argv[1].ex_cont.v_int;
      lVar7 = 0;
      do {
        dVar8 = pow((double)ptVar4[lVar7],(double)lVar6);
        ptVar5[lVar7] = (float)dVar8;
        lVar7 = lVar7 + 1;
      } while (iVar2 != (int)lVar7);
      return;
    }
  }
  else if (lVar6 == 2) {
    lVar6 = argv[1].ex_type;
    if (lVar6 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_0019a01e;
        optr->ex_type = 0xf;
        ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar5;
      }
      iVar2 = e->exp_vsize;
      if (iVar2 == 0) {
        return;
      }
      ptVar5 = (optr->ex_cont).v_vec;
      ptVar4 = argv[1].ex_cont.v_vec;
      fVar1 = (argv->ex_cont).v_flt;
      lVar6 = 0;
      do {
        dVar8 = pow((double)fVar1,(double)ptVar4[lVar6]);
        ptVar5[lVar6] = (float)dVar8;
        lVar6 = lVar6 + 1;
      } while (iVar2 != (int)lVar6);
      return;
    }
    if (lVar6 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = pow((double)(argv->ex_cont).v_flt,(double)argv[1].ex_cont.v_flt);
        iVar2 = e->exp_vsize;
        if (iVar2 == 0) {
          return;
        }
        lVar6 = 0;
        do {
          ptVar5[lVar6] = (float)dVar8;
          lVar6 = lVar6 + 1;
        } while (iVar2 != (int)lVar6);
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_flt;
LAB_00199ffd:
      __y = (double)argv[1].ex_cont.v_flt;
LAB_0019a002:
      dVar8 = pow(dVar8,__y);
      (optr->ex_cont).v_flt = (float)dVar8;
      return;
    }
    if (lVar6 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = pow((double)(argv->ex_cont).v_flt,(double)argv[1].ex_cont.v_int);
        iVar2 = e->exp_vsize;
        if (iVar2 == 0) {
          return;
        }
        lVar6 = 0;
        do {
          ptVar5[lVar6] = (float)dVar8;
          lVar6 = lVar6 + 1;
        } while (iVar2 != (int)lVar6);
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_flt;
LAB_00199fda:
      __y = (double)argv[1].ex_cont.v_int;
      goto LAB_0019a002;
    }
  }
  else {
    if (lVar6 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_00199d98;
    }
    lVar6 = argv[1].ex_type;
    if (lVar6 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_0019a01e;
        optr->ex_type = 0xf;
        ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar5;
      }
      iVar2 = e->exp_vsize;
      if (iVar2 == 0) {
        return;
      }
      lVar6 = (argv->ex_cont).v_int;
      ptVar5 = (optr->ex_cont).v_vec;
      ptVar4 = argv[1].ex_cont.v_vec;
      lVar7 = 0;
      do {
        dVar8 = pow((double)lVar6,(double)ptVar4[lVar7]);
        ptVar5[lVar7] = (float)dVar8;
        lVar7 = lVar7 + 1;
      } while (iVar2 != (int)lVar7);
      return;
    }
    if (lVar6 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = pow((double)(argv->ex_cont).v_int,(double)argv[1].ex_cont.v_flt);
        iVar2 = e->exp_vsize;
        if (iVar2 == 0) {
          return;
        }
        lVar6 = 0;
        do {
          ptVar5[lVar6] = (float)dVar8;
          lVar6 = lVar6 + 1;
        } while (iVar2 != (int)lVar6);
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_int;
      goto LAB_00199ffd;
    }
    if (lVar6 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar5 = (optr->ex_cont).v_vec;
        dVar8 = pow((double)(argv->ex_cont).v_int,(double)argv[1].ex_cont.v_int);
        iVar2 = e->exp_vsize;
        if (iVar2 == 0) {
          return;
        }
        lVar6 = 0;
        do {
          ptVar5[lVar6] = (float)dVar8;
          lVar6 = lVar6 + 1;
        } while (iVar2 != (int)lVar6);
        return;
      }
      optr->ex_type = 2;
      dVar8 = (double)(argv->ex_cont).v_int;
      goto LAB_00199fda;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_00199d98:
  pd_error(e,fmt,0x26a);
  return;
}

Assistant:

static void
ex_pow(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, pow, (double), (double), optr, 1);
}